

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lu_solve_sparse.c
# Opt level: O2

void __thiscall
lu_solve_sparse(void *this,lu_int nrhs,lu_int *irhs,double *xrhs,lu_int *p_nlhs,lu_int *ilhs,
               double *xlhs,char trans)

{
  lu_int *plVar1;
  lu_int *plVar2;
  double *value;
  double *lhs;
  lu_int *plVar3;
  lu_int *begin;
  int iVar4;
  uint uVar5;
  lu_int lVar6;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  lu_int m;
  long lVar11;
  long lVar12;
  int iVar13;
  int iVar14;
  double dVar15;
  lu_int Uflops;
  lu_int Lflops;
  lu_int *local_120;
  lu_int *local_118;
  double local_110;
  ulong local_108;
  int *local_100;
  int local_f4;
  lu_int *local_f0;
  lu_int *local_e8;
  lu_int *local_e0;
  lu_int *local_d8;
  double *local_d0;
  uint *local_c8;
  void *local_c0;
  lu_int *local_b8;
  lu_int *local_b0;
  lu_int *local_a8;
  double *local_a0;
  double *local_98;
  lu_int *local_90;
  long local_88;
  long local_80;
  long local_78;
  lu_int *local_70;
  long local_68;
  long local_60;
  long local_58;
  ulong local_50;
  double *local_48;
  double *local_40;
  long local_38;
  
  iVar8 = *(int *)((long)this + 0x54);
  local_108 = (ulong)iVar8;
  uVar7 = *(uint *)((long)this + 0x68);
  local_50 = (ulong)*(uint *)((long)this + 400);
  local_110 = *(double *)((long)this + 0x10);
  local_68 = *(long *)((long)this + 0x250);
  local_38 = *(long *)((long)this + 0x260);
  local_60 = *(long *)((long)this + 0x270);
  local_88 = *(long *)((long)this + 0x200);
  local_78 = *(long *)((long)this + 0x1d8);
  local_58 = *(long *)((long)this + 0x1e8);
  local_d8 = *(lu_int **)((long)this + 0x220);
  local_70 = *(lu_int **)((long)this + 0x230);
  local_80 = *(long *)((long)this + 0x240);
  local_a8 = *(lu_int **)((long)this + 0x280);
  local_100 = *(int **)((long)this + 0x1f8);
  local_e8 = *(lu_int **)((long)this + 0x228);
  local_40 = *(double **)((long)this + 0x2a8);
  local_a0 = *(double **)((long)this + 0x2b0);
  plVar2 = *(lu_int **)((long)this + 0x1a0);
  value = *(double **)((long)this + 0x1b8);
  local_b0 = *(lu_int **)((long)this + 0x1a8);
  local_98 = *(double **)((long)this + 0x1c0);
  local_48 = *(double **)((long)this + 0x1c8);
  local_120 = *(lu_int **)((long)this + 0x290);
  Lflops = 0;
  Uflops = 0;
  uVar5 = *(int *)((long)this + 0x18c) + 1;
  local_e0 = (lu_int *)(ulong)uVar5;
  uVar10 = 0;
  if (0 < nrhs) {
    uVar10 = (ulong)(uint)nrhs;
  }
  local_b8 = *(lu_int **)((long)this + 0x210);
  lhs = *(double **)((long)this + 0x298);
  local_90 = *(lu_int **)((long)this + 0x2a0);
  *(uint *)((long)this + 0x18c) = uVar5;
  local_f4 = (int)((double)iVar8 * *(double *)((long)this + 0x48));
  local_118 = irhs;
  local_f0 = ilhs;
  local_d0 = xrhs;
  local_c8 = (uint *)p_nlhs;
  local_c0 = this;
  if ((trans & 0xdfU) == 0x54) {
    local_e0 = *(lu_int **)((long)this + 0x218);
    local_d8 = *(lu_int **)((long)this + 0x1b0);
    lVar6 = lu_solve_symbolic(iVar8,*(lu_int **)((long)this + 0x218),local_e8,
                              *(lu_int **)((long)this + 0x1b0),nrhs,irhs,local_b8,local_90,local_120
                              ,uVar5);
    for (uVar9 = 0; uVar10 != uVar9; uVar9 = uVar9 + 1) {
      lhs[irhs[uVar9]] = local_d0[uVar9];
    }
    plVar1 = local_b8 + local_108;
    uVar5 = lu_solve_triangular((int)local_108 - lVar6,local_b8 + lVar6,local_e0,local_e8,local_d8,
                                local_48,local_40,local_110,lhs,plVar1,&Uflops);
    begin = local_70;
    plVar3 = local_b8;
    iVar8 = *(int *)((long)local_c0 + 0x18c) + 1;
    *(int *)((long)local_c0 + 0x18c) = iVar8;
    uVar9 = 0;
    uVar10 = (ulong)uVar5;
    if ((int)uVar5 < 1) {
      uVar10 = uVar9;
    }
    for (; uVar10 != uVar9; uVar9 = uVar9 + 1) {
      lVar11 = (long)plVar1[uVar9];
      iVar14 = *(int *)(local_38 + lVar11 * 4);
      plVar1[uVar9] = iVar14;
      xlhs[iVar14] = lhs[lVar11];
      lhs[lVar11] = 0.0;
      local_120[iVar14] = iVar8;
    }
    iVar14 = 0;
    uVar10 = (ulong)uVar7;
    while (uVar9 = uVar10, 0 < (int)uVar9) {
      uVar10 = uVar9 - 1;
      dVar15 = xlhs[*(int *)(local_88 + -4 + uVar9 * 4)];
      if ((dVar15 != 0.0) || (NAN(dVar15))) {
        for (lVar11 = (long)local_100[uVar10]; lVar11 < local_100[uVar9]; lVar11 = lVar11 + 1) {
          iVar13 = plVar2[lVar11];
          if (local_120[iVar13] != iVar8) {
            local_120[iVar13] = iVar8;
            lVar12 = (long)(int)uVar5;
            uVar5 = uVar5 + 1;
            plVar1[lVar12] = iVar13;
          }
          xlhs[iVar13] = value[lVar11] * -dVar15 + xlhs[iVar13];
          iVar14 = iVar14 + 1;
        }
      }
    }
    if (local_f4 < (int)uVar5) {
      local_108 = local_108 & 0xffffffff;
      uVar7 = 0;
      lVar6 = Lflops;
      while (0 < (int)local_108) {
        iVar8 = *(int *)(local_68 + -4 + local_108 * 4);
        local_108 = local_108 - 1;
        dVar15 = xlhs[iVar8];
        if ((dVar15 != 0.0) || (NAN(dVar15))) {
          for (lVar11 = (long)*(int *)(local_80 + local_108 * 4); lVar12 = (long)plVar2[lVar11],
              -1 < lVar12; lVar11 = lVar11 + 1) {
            xlhs[lVar12] = value[lVar11] * -dVar15 + xlhs[lVar12];
            lVar6 = lVar6 + 1;
            Lflops = lVar6;
          }
          if (local_110 < ABS(dVar15)) {
            uVar10 = (ulong)uVar7;
            uVar7 = uVar7 + 1;
            local_f0[uVar10] = iVar8;
          }
          else {
            xlhs[iVar8] = 0.0;
          }
        }
      }
    }
    else {
      iVar13 = *(int *)((long)local_c0 + 0x18c) + 1;
      *(int *)((long)local_c0 + 0x18c) = iVar13;
      iVar8 = (int)local_108;
      lVar6 = lu_solve_symbolic(iVar8,local_70,(lu_int *)0x0,plVar2,uVar5,plVar1,local_b8,local_90,
                                local_120,iVar13);
      uVar7 = lu_solve_triangular(iVar8 - lVar6,plVar3 + lVar6,begin,(lu_int *)0x0,plVar2,value,
                                  (double *)0x0,local_110,xlhs,local_f0,&Lflops);
    }
  }
  else {
    local_e8 = (lu_int *)(long)(int)uVar7;
    lVar6 = lu_solve_symbolic(iVar8,local_d8,(lu_int *)0x0,plVar2,nrhs,irhs,local_b8,local_90,
                              local_120,uVar5);
    for (uVar9 = 0; uVar10 != uVar9; uVar9 = uVar9 + 1) {
      lhs[local_118[uVar9]] = local_d0[uVar9];
    }
    local_118 = local_b8 + local_108;
    iVar8 = (int)local_108 - lVar6;
    local_d0 = (double *)CONCAT44(local_d0._4_4_,iVar8);
    lVar11 = (long)lVar6;
    uVar10 = 0;
    iVar8 = lu_solve_triangular(iVar8,local_b8 + lVar11,local_d8,(lu_int *)0x0,plVar2,value,
                                (double *)0x0,local_110,lhs,local_118,&Lflops);
    plVar3 = local_a8;
    plVar1 = local_b8;
    if (iVar8 < (int)local_d0) {
      iVar14 = 0;
      while (iVar14 < iVar8) {
        if (local_b8[lVar11] == local_118[iVar14]) {
          iVar14 = iVar14 + 1;
        }
        else {
          local_120[local_b8[lVar11]] = local_120[local_b8[lVar11]] + -1;
        }
        lVar11 = lVar11 + 1;
      }
      for (; lVar11 < (long)local_108; lVar11 = lVar11 + 1) {
        local_120[local_b8[lVar11]] = local_120[local_b8[lVar11]] + -1;
      }
    }
    iVar14 = *local_100;
    uVar9 = (ulong)uVar7;
    if ((int)uVar7 < 1) {
      uVar9 = uVar10;
    }
    while (uVar10 != uVar9) {
      iVar13 = *(int *)(local_88 + uVar10 * 4);
      lVar12 = (long)iVar14;
      lVar11 = uVar10 + 1;
      uVar10 = uVar10 + 1;
      iVar4 = local_100[lVar11];
      if (local_100[lVar11] < iVar14) {
        iVar4 = iVar14;
      }
      iVar14 = iVar4;
      dVar15 = 0.0;
      for (; iVar14 != lVar12; lVar12 = lVar12 + 1) {
        dVar15 = dVar15 + lhs[plVar2[lVar12]] * value[lVar12];
      }
      lhs[iVar13] = lhs[iVar13] - dVar15;
      if (((dVar15 != 0.0) || (NAN(dVar15))) && (local_120[iVar13] != (int)local_e0)) {
        local_120[iVar13] = (int)local_e0;
        lVar11 = (long)iVar8;
        iVar8 = iVar8 + 1;
        local_118[lVar11] = iVar13;
      }
    }
    iVar14 = local_100[(long)local_e8] - *local_100;
    if (local_f4 < iVar8) {
      uVar7 = 0;
      lVar6 = Uflops;
      while (0 < (int)local_50) {
        iVar8 = *(int *)(local_58 + -4 + local_50 * 4);
        local_50 = local_50 - 1;
        dVar15 = lhs[iVar8];
        if ((dVar15 != 0.0) || (NAN(dVar15))) {
          dVar15 = dVar15 / local_a0[iVar8];
          iVar13 = *(int *)(local_78 + local_50 * 4);
          lhs[iVar8] = 0.0;
          for (lVar11 = (long)local_a8[iVar8]; lVar12 = (long)local_b0[lVar11], -1 < lVar12;
              lVar11 = lVar11 + 1) {
            lhs[lVar12] = local_98[lVar11] * -dVar15 + lhs[lVar12];
            lVar6 = lVar6 + 1;
            Uflops = lVar6;
          }
          if (local_110 < ABS(dVar15)) {
            uVar10 = (ulong)uVar7;
            uVar7 = uVar7 + 1;
            local_f0[uVar10] = iVar13;
            xlhs[iVar13] = dVar15;
          }
        }
      }
    }
    else {
      iVar13 = *(int *)((long)local_c0 + 0x18c) + 1;
      *(int *)((long)local_c0 + 0x18c) = iVar13;
      uVar9 = 0;
      m = (lu_int)local_108;
      lVar6 = lu_solve_symbolic(m,local_a8,(lu_int *)0x0,local_b0,iVar8,local_118,local_b8,local_90,
                                local_120,iVar13);
      plVar2 = local_f0;
      uVar7 = lu_solve_triangular(m - lVar6,plVar1 + lVar6,plVar3,(lu_int *)0x0,local_b0,local_98,
                                  local_a0,local_110,lhs,local_f0,&Uflops);
      uVar10 = 0;
      if (0 < (int)uVar7) {
        uVar10 = (ulong)uVar7;
      }
      for (; uVar10 != uVar9; uVar9 = uVar9 + 1) {
        lVar11 = (long)plVar2[uVar9];
        iVar8 = *(int *)(local_60 + lVar11 * 4);
        plVar2[uVar9] = iVar8;
        xlhs[iVar8] = lhs[lVar11];
        lhs[lVar11] = 0.0;
      }
    }
  }
  *local_c8 = uVar7;
  *(int *)((long)local_c0 + 0xe0) = *(int *)((long)local_c0 + 0xe0) + Lflops;
  *(int *)((long)local_c0 + 0xe4) = *(int *)((long)local_c0 + 0xe4) + Uflops;
  *(int *)((long)local_c0 + 0xe8) = *(int *)((long)local_c0 + 0xe8) + iVar14;
  *(double *)((long)local_c0 + 0xa0) = (double)iVar14 + *(double *)((long)local_c0 + 0xa0);
  return;
}

Assistant:

void lu_solve_sparse(
    struct lu *this, const lu_int nrhs, const lu_int *irhs, const double *xrhs,
    lu_int *p_nlhs, lu_int *ilhs, double *xlhs, char trans)
{
    const lu_int m                  = this->m;
    const lu_int nforrest           = this->nforrest;
    const lu_int pivotlen           = this->pivotlen;
    const lu_int nz_sparse          = this->sparse_thres * m;
    const double droptol            = this->droptol;
    const lu_int *p                 = this->p;
    const lu_int *pmap              = this->pmap;
    const lu_int *qmap              = this->qmap;
    const lu_int *eta_row           = this->eta_row;
    const lu_int *pivotcol          = this->pivotcol;
    const lu_int *pivotrow          = this->pivotrow;
    const lu_int *Lbegin            = this->Lbegin;
    const lu_int *Ltbegin           = this->Ltbegin;
    const lu_int *Ltbegin_p         = this->Ltbegin_p;
    const lu_int *Ubegin            = this->Ubegin;
    const lu_int *Rbegin            = this->Rbegin;
    const lu_int *Wbegin            = this->Wbegin;
    const lu_int *Wend              = this->Wend;
    const double *col_pivot         = this->col_pivot;
    const double *row_pivot         = this->row_pivot;
    const lu_int *Lindex            = this->Lindex;
    const double *Lvalue            = this->Lvalue;
    const lu_int *Uindex            = this->Uindex;
    const double *Uvalue            = this->Uvalue;
    const lu_int *Windex            = this->Windex;
    const double *Wvalue            = this->Wvalue;
    lu_int *marked                  = this->marked;

    lu_int i, j, k, n, t, top, pos, ipivot, jpivot, nz, nz_symb, M;
    double x;

    lu_int Lflops = 0, Uflops = 0, Rflops = 0;

    if (trans == 't' || trans == 'T')
    {
        /* ----------------------- */
        /* Solve transposed system */
        /* ----------------------- */

        lu_int *pattern_symb = this->iwork1;
        lu_int *pattern      = this->iwork1 + m;
        double *work         = this->work0;
        lu_int *pstack       = (void *) this->work1;
        assert(sizeof(lu_int) <= sizeof(double));

        /*
         * Sparse triangular solve with U'.
         * Solution scattered into work, indices in pattern[0..nz-1].
         */
        M = ++this->marker;
        top = lu_solve_symbolic(m, Wbegin, Wend, Windex, nrhs, irhs,
                                pattern_symb, pstack, marked, M);
        nz_symb = m-top;

        for (n = 0; n < nrhs; n++)
            work[irhs[n]] = xrhs[n];
        nz = lu_solve_triangular(nz_symb, pattern_symb+top, Wbegin, Wend,
                                 Windex, Wvalue, col_pivot, droptol, work,
                                 pattern, &Uflops);

        /*
         * Permute solution into xlhs.
         * Map pattern from column indices to row indices.
         */
        M = ++this->marker;
        for (n = 0; n < nz; n++)
        {
            j = pattern[n];
            i = pmap[j];
            pattern[n] = i;
            xlhs[i] = work[j];
            work[j] = 0;
            marked[i] = M;
        }

        /*
         * Solve with update etas.
         * Append fill-in to pattern.
         */
        for (t = nforrest-1; t >= 0; t--)
        {
            ipivot = eta_row[t];
            if (xlhs[ipivot])
            {
                x = xlhs[ipivot];
                for (pos = Rbegin[t]; pos < Rbegin[t+1]; pos++)
                {
                    i = Lindex[pos];
                    if (marked[i] != M)
                    {
                        marked[i] = M;
                        pattern[nz++] = i;
                    }
                    xlhs[i] -= x * Lvalue[pos];
                    Rflops++;
                }
            }
        }

        if (nz <= nz_sparse)
        {
            /*
             * Sparse triangular solve with L'.
             * Solution scattered into xlhs, indices in ilhs[0..nz-1].
             */
            M = ++this->marker;
            top = lu_solve_symbolic(m, Ltbegin, NULL, Lindex, nz, pattern,
                                    pattern_symb, pstack, marked, M);
            nz_symb = m-top;

            nz = lu_solve_triangular(nz_symb, pattern_symb+top, Ltbegin, NULL,
                                      Lindex, Lvalue, NULL, droptol, xlhs, ilhs,
                                      &Lflops);
            *p_nlhs = nz;
        }
        else
        {
            /*
             * Sequential triangular solve with L'.
             * Solution scattered into xlhs, indices in ilhs[0..nz-1].
             */
            nz = 0;
            for (k = m-1; k >= 0; k--)
            {
                ipivot = p[k];
                if (xlhs[ipivot])
                {
                    x = xlhs[ipivot];
                    for (pos = Ltbegin_p[k]; (i = Lindex[pos]) >= 0; pos++)
                    {
                        xlhs[i] -= x * Lvalue[pos];
                        Lflops++;
                    }
                    if (fabs(x) > droptol)
                        ilhs[nz++] = ipivot;
                    else
                        xlhs[ipivot] = 0.0;
                }
            }
            *p_nlhs = nz;
        }
    }
    else
    {
        /* -------------------- */
        /* Solve forward system */
        /* -------------------- */

        lu_int *pattern_symb = this->iwork1;
        lu_int *pattern      = this->iwork1 + m;
        double *work         = this->work0;
        lu_int *pstack       = (void *) this->work1;
        assert(sizeof(lu_int) <= sizeof(double));

        /*
         * Sparse triangular solve with L.
         * Solution scattered into work, indices in pattern[0..nz-1].
         */
        M = ++this->marker;
        top = lu_solve_symbolic(m, Lbegin, NULL, Lindex, nrhs, irhs,
                                pattern_symb, pstack, marked, M);
        nz_symb = m-top;

        for (n = 0; n < nrhs; n++)
            work[irhs[n]] = xrhs[n];
        nz = lu_solve_triangular(nz_symb, pattern_symb+top, Lbegin, NULL,
                                 Lindex, Lvalue, NULL, droptol, work, pattern,
                                 &Lflops);

        /* unmark cancellation */
        if (nz < nz_symb)
        {
            for (t = top, n = 0; n < nz; t++)
            {
                i = pattern_symb[t];
                if (i == pattern[n])
                    n++;
                else
                    marked[i]--;
            }
            for ( ; t < m; t++)
                marked[pattern_symb[t]]--;
        }

        /*
         * Solve with update etas.
         * Append fill-in to pattern.
         */
        pos = Rbegin[0];
        for (t = 0; t < nforrest; t++)
        {
            ipivot = eta_row[t];
            x = 0.0;
            for ( ; pos < Rbegin[t+1]; pos++)
            {
                x += work[Lindex[pos]] * Lvalue[pos];
            }
            work[ipivot] -= x;
            if (x && marked[ipivot] != M)
            {
                marked[ipivot] = M;
                pattern[nz++] = ipivot;
            }
        }
        Rflops += Rbegin[nforrest] - Rbegin[0];

        if (nz <= nz_sparse)
        {
            /*
             * Sparse triangular solve with U.
             * Solution scattered into work, indices in ilhs[0..nz-1].
             */
            M = ++this->marker;
            top = lu_solve_symbolic(m, Ubegin, NULL, Uindex, nz, pattern,
                                    pattern_symb, pstack, marked, M);
            nz_symb = m-top;

            nz = lu_solve_triangular(nz_symb, pattern_symb+top, Ubegin, NULL,
                                     Uindex, Uvalue, row_pivot, droptol, work,
                                     ilhs, &Uflops);

            /*
             * Permute solution into xlhs.
             * Map pattern from row indices to column indices.
             */
            for (n = 0; n < nz; n++)
            {
                i = ilhs[n];
                j = qmap[i];
                ilhs[n] = j;
                xlhs[j] = work[i];
                work[i] = 0;
            }
        }
        else
        {
            /*
             * Sequential triangular solve with U.
             * Solution computed in work and permuted into xlhs.
             * Pattern (in column indices) stored in ilhs[0..nz-1].
             */
            nz = 0;
            for (k = pivotlen-1; k >= 0; k--)
            {
                ipivot = pivotrow[k];
                jpivot = pivotcol[k];
                if (work[ipivot])
                {
                    x = work[ipivot] / row_pivot[ipivot];
                    work[ipivot] = 0.0;
                    for (pos = Ubegin[ipivot]; (i = Uindex[pos]) >= 0; pos++)
                    {
                        work[i] -= x * Uvalue[pos];
                        Uflops++;
                    }
                    if (fabs(x) > droptol)
                    {
                        ilhs[nz++] = jpivot;
                        xlhs[jpivot] = x;
                    }
                }
            }
        }
        *p_nlhs = nz;
    }

    this->Lflops += Lflops;
    this->Uflops += Uflops;
    this->Rflops += Rflops;
    this->update_cost_numer += Rflops;
}